

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema.c++
# Opt level: O0

Type __thiscall capnp::Schema::interpretType(Schema *this,Reader proto,uint location)

{
  Reader proto_00;
  Which WVar1;
  Which WVar2;
  Which anyPointerKind;
  uint16_t uVar3;
  StructSchema schema;
  EnumSchema schema_00;
  uint64_t uVar4;
  Type elementType;
  Reader local_230;
  uint local_1fc;
  undefined1 local_1f8 [8];
  Reader param;
  undefined1 local_198 [8];
  Reader anyPointer;
  Reader local_138;
  Type local_108;
  Type local_f8;
  Schema local_e8;
  Schema local_e0;
  undefined1 local_d8 [8];
  Reader interfaceType;
  undefined1 local_98 [8];
  Reader enumType;
  undefined1 local_58 [8];
  Reader structType;
  uint location_local;
  Schema *this_local;
  
  structType._reader._44_4_ = location;
  WVar1 = capnp::schema::Type::Reader::which(&proto);
  switch(WVar1) {
  case VOID:
  case BOOL:
  case INT8:
  case INT16:
  case INT32:
  case INT64:
  case UINT8:
  case UINT16:
  case UINT32:
  case UINT64:
  case FLOAT32:
  case FLOAT64:
  case TEXT:
  case DATA:
    WVar1 = capnp::schema::Type::Reader::which(&proto);
    capnp::Type::Type((Type *)&this_local,WVar1);
    break;
  case LIST:
    capnp::schema::Type::Reader::getList((Reader *)&anyPointer._reader.nestingLimit,&proto);
    capnp::schema::Type::List::Reader::getElementType
              (&local_138,(Reader *)&anyPointer._reader.nestingLimit);
    proto_00._reader.capTable = local_138._reader.capTable;
    proto_00._reader.segment = local_138._reader.segment;
    proto_00._reader.data = local_138._reader.data;
    proto_00._reader.pointers = local_138._reader.pointers;
    proto_00._reader.dataSize = local_138._reader.dataSize;
    proto_00._reader.pointerCount = local_138._reader.pointerCount;
    proto_00._reader._38_2_ = local_138._reader._38_2_;
    proto_00._reader.nestingLimit = local_138._reader.nestingLimit;
    proto_00._reader._44_4_ = local_138._reader._44_4_;
    local_108 = interpretType(this,proto_00,structType._reader._44_4_);
    elementType.field_4 = local_108.field_4;
    elementType._0_8_ = elementType.field_4;
    local_f8 = (Type)ListSchema::of((ListSchema *)local_108._0_8_,elementType);
    capnp::Type::Type((Type *)&this_local,(ListSchema)local_f8);
    break;
  case ENUM:
    capnp::schema::Type::Reader::getEnum((Reader *)local_98,&proto);
    uVar4 = capnp::schema::Type::Enum::Reader::getTypeId((Reader *)local_98);
    interfaceType._reader._40_8_ = getDependency(this,uVar4,structType._reader._44_4_);
    schema_00 = asEnum((Schema *)&interfaceType._reader.nestingLimit);
    capnp::Type::Type((Type *)&this_local,schema_00);
    break;
  case STRUCT:
    capnp::schema::Type::Reader::getStruct((Reader *)local_58,&proto);
    uVar4 = capnp::schema::Type::Struct::Reader::getTypeId((Reader *)local_58);
    enumType._reader._40_8_ = getDependency(this,uVar4,structType._reader._44_4_);
    schema = asStruct((Schema *)&enumType._reader.nestingLimit);
    capnp::Type::Type((Type *)&this_local,schema);
    break;
  case INTERFACE:
    capnp::schema::Type::Reader::getInterface((Reader *)local_d8,&proto);
    uVar4 = capnp::schema::Type::Interface::Reader::getTypeId((Reader *)local_d8);
    local_e8 = getDependency(this,uVar4,structType._reader._44_4_);
    local_e0.raw = (RawBrandedSchema *)asInterface(&local_e8);
    capnp::Type::Type((Type *)&this_local,(InterfaceSchema)local_e0.raw);
    break;
  case ANY_POINTER:
    capnp::schema::Type::Reader::getAnyPointer((Reader *)local_198,&proto);
    WVar2 = capnp::schema::Type::AnyPointer::Reader::which((Reader *)local_198);
    if (WVar2 == UNCONSTRAINED) {
      capnp::schema::Type::AnyPointer::Reader::getUnconstrained
                ((Reader *)&param._reader.nestingLimit,(Reader *)local_198);
      anyPointerKind =
           capnp::schema::Type::AnyPointer::Unconstrained::Reader::which
                     ((Reader *)&param._reader.nestingLimit);
      capnp::Type::Type((Type *)&this_local,anyPointerKind);
    }
    else if (WVar2 == PARAMETER) {
      capnp::schema::Type::AnyPointer::Reader::getParameter((Reader *)local_1f8,(Reader *)local_198)
      ;
      uVar4 = capnp::schema::Type::AnyPointer::Parameter::Reader::getScopeId((Reader *)local_1f8);
      uVar3 = capnp::schema::Type::AnyPointer::Parameter::Reader::getParameterIndex
                        ((Reader *)local_1f8);
      _this_local = getBrandBinding(this,uVar4,(uint)uVar3);
    }
    else {
      if (WVar2 != IMPLICIT_METHOD_PARAMETER) {
        kj::_::unreachable();
      }
      capnp::schema::Type::AnyPointer::Reader::getImplicitMethodParameter
                (&local_230,(Reader *)local_198);
      local_1fc._0_2_ =
           capnp::schema::Type::AnyPointer::ImplicitMethodParameter::Reader::getParameterIndex
                     (&local_230);
      local_1fc._2_2_ = 0;
      capnp::Type::Type((Type *)&this_local,(ImplicitParameter)local_1fc);
    }
    break;
  default:
    kj::_::unreachable();
  }
  return _this_local;
}

Assistant:

Type Schema::interpretType(schema::Type::Reader proto, uint location) const {
  switch (proto.which()) {
    case schema::Type::VOID:
    case schema::Type::BOOL:
    case schema::Type::INT8:
    case schema::Type::INT16:
    case schema::Type::INT32:
    case schema::Type::INT64:
    case schema::Type::UINT8:
    case schema::Type::UINT16:
    case schema::Type::UINT32:
    case schema::Type::UINT64:
    case schema::Type::FLOAT32:
    case schema::Type::FLOAT64:
    case schema::Type::TEXT:
    case schema::Type::DATA:
      return proto.which();

    case schema::Type::STRUCT: {
      auto structType = proto.getStruct();
      return getDependency(structType.getTypeId(), location).asStruct();
    }

    case schema::Type::ENUM: {
      auto enumType = proto.getEnum();
      return getDependency(enumType.getTypeId(), location).asEnum();
    }

    case schema::Type::INTERFACE: {
      auto interfaceType = proto.getInterface();
      return getDependency(interfaceType.getTypeId(), location).asInterface();
    }

    case schema::Type::LIST:
      return ListSchema::of(interpretType(proto.getList().getElementType(), location));

    case schema::Type::ANY_POINTER: {
      auto anyPointer = proto.getAnyPointer();
      switch (anyPointer.which()) {
        case schema::Type::AnyPointer::UNCONSTRAINED:
          return anyPointer.getUnconstrained().which();
        case schema::Type::AnyPointer::PARAMETER: {
          auto param = anyPointer.getParameter();
          return getBrandBinding(param.getScopeId(), param.getParameterIndex());
        }
        case schema::Type::AnyPointer::IMPLICIT_METHOD_PARAMETER:
          return Type(Type::ImplicitParameter {
              anyPointer.getImplicitMethodParameter().getParameterIndex() });
      }

      KJ_UNREACHABLE;
    }
  }

  KJ_UNREACHABLE;
}